

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeUVMappingProcess.cpp
# Opt level: O3

void __thiscall
Assimp::ComputeUVMappingProcess::ComputeSphereMapping
          (ComputeUVMappingProcess *this,aiMesh *mesh,aiVector3D *axis,aiVector3D *out)

{
  aiVector3D *paVar1;
  ulong uVar2;
  long lVar3;
  float fVar4;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  float extraout_XMM0_Db_06;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  aiVector3D local_b8;
  float local_a8;
  float fStack_a4;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  aiMatrix3x3t<float> local_68;
  aiVector3D local_40;
  aiVector3D local_30;
  
  local_b8.x = 0.0;
  local_b8.y = 0.0;
  local_b8.z = 0.0;
  local_30.x = 0.0;
  local_30.y = 0.0;
  local_30.z = 0.0;
  local_40.x = 0.0;
  local_40.y = 0.0;
  local_40.z = 0.0;
  FindMeshCenter(mesh,&local_b8,&local_30,&local_40);
  fVar11 = axis->x;
  fVar5 = axis->y * 0.0;
  fVar12 = axis->z * 0.0;
  if (0.95 <= fVar11 + fVar5 + fVar12) {
    if (mesh->mNumVertices != 0) {
      lVar3 = 8;
      uVar2 = 0;
      do {
        paVar1 = mesh->mVertices;
        fVar4 = *(float *)((long)paVar1 + lVar3 + -8) - local_b8.x;
        fVar5 = *(float *)((long)paVar1 + lVar3 + -4) - local_b8.y;
        fVar12 = *(float *)((long)&paVar1->x + lVar3) - local_b8.z;
        fVar11 = 1.0 / SQRT(fVar12 * fVar12 + fVar4 * fVar4 + fVar5 * fVar5);
        local_a8 = atan2f(fVar11 * fVar12,fVar5 * fVar11);
        fStack_a4 = extraout_XMM0_Db_01;
        fVar11 = asinf(fVar4 * fVar11);
        auVar8._0_4_ = local_a8 + 3.1415927;
        auVar8._4_4_ = fVar11 + 1.5707964;
        auVar8._8_4_ = fStack_a4 + 0.0;
        auVar8._12_4_ = extraout_XMM0_Db_02 + 0.0;
        auVar8 = divps(auVar8,_DAT_006aea20);
        *(long *)((long)out + lVar3 + -8) = auVar8._0_8_;
        *(undefined4 *)((long)&out->x + lVar3) = 0;
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0xc;
      } while (uVar2 < mesh->mNumVertices);
    }
  }
  else if (0.95 <= fVar12 + fVar11 * 0.0 + axis->y) {
    if (mesh->mNumVertices != 0) {
      lVar3 = 8;
      uVar2 = 0;
      do {
        paVar1 = mesh->mVertices;
        fVar11 = *(float *)((long)paVar1 + lVar3 + -8) - local_b8.x;
        fVar4 = *(float *)((long)paVar1 + lVar3 + -4) - local_b8.y;
        fVar12 = *(float *)((long)&paVar1->x + lVar3) - local_b8.z;
        fVar5 = 1.0 / SQRT(fVar12 * fVar12 + fVar11 * fVar11 + fVar4 * fVar4);
        local_a8 = atan2f(fVar11 * fVar5,fVar5 * fVar12);
        fStack_a4 = extraout_XMM0_Db_03;
        fVar11 = asinf(fVar4 * fVar5);
        auVar9._0_4_ = local_a8 + 3.1415927;
        auVar9._4_4_ = fVar11 + 1.5707964;
        auVar9._8_4_ = fStack_a4 + 0.0;
        auVar9._12_4_ = extraout_XMM0_Db_04 + 0.0;
        auVar8 = divps(auVar9,_DAT_006aea20);
        *(long *)((long)out + lVar3 + -8) = auVar8._0_8_;
        *(undefined4 *)((long)&out->x + lVar3) = 0;
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0xc;
      } while (uVar2 < mesh->mNumVertices);
    }
  }
  else if (0.95 <= axis->z + fVar11 * 0.0 + fVar5) {
    if (mesh->mNumVertices != 0) {
      lVar3 = 8;
      uVar2 = 0;
      do {
        paVar1 = mesh->mVertices;
        fVar5 = *(float *)((long)paVar1 + lVar3 + -8) - local_b8.x;
        fVar11 = *(float *)((long)paVar1 + lVar3 + -4) - local_b8.y;
        fVar12 = *(float *)((long)&paVar1->x + lVar3) - local_b8.z;
        fVar4 = 1.0 / SQRT(fVar12 * fVar12 + fVar5 * fVar5 + fVar11 * fVar11);
        local_a8 = atan2f(fVar11 * fVar4,fVar5 * fVar4);
        fStack_a4 = extraout_XMM0_Db_05;
        fVar11 = asinf(fVar4 * fVar12);
        auVar10._0_4_ = local_a8 + 3.1415927;
        auVar10._4_4_ = fVar11 + 1.5707964;
        auVar10._8_4_ = fStack_a4 + 0.0;
        auVar10._12_4_ = extraout_XMM0_Db_06 + 0.0;
        auVar8 = divps(auVar10,_DAT_006aea20);
        *(long *)((long)out + lVar3 + -8) = auVar8._0_8_;
        *(undefined4 *)((long)&out->x + lVar3) = 0;
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0xc;
      } while (uVar2 < mesh->mNumVertices);
    }
  }
  else {
    local_68.a1 = 1.0;
    local_68.a2 = 0.0;
    local_68.a3 = 0.0;
    local_68.b1 = 0.0;
    local_68.b2 = 1.0;
    local_68.b3 = 0.0;
    local_68.c1 = 0.0;
    local_68.c2 = 0.0;
    local_68.c3 = 1.0;
    aiMatrix3x3t<float>::FromToMatrix
              (axis,(aiVector3t<float> *)::(anonymous_namespace)::base_axis_y,&local_68);
    if (mesh->mNumVertices != 0) {
      local_6c = local_68.a1;
      local_70 = local_68.a2;
      local_74 = local_68.a3;
      local_78 = local_68.b1;
      local_7c = local_68.b2;
      local_80 = local_68.b3;
      local_84 = local_68.c1;
      local_88 = local_68.c2;
      local_8c = local_68.c3;
      lVar3 = 8;
      uVar2 = 0;
      do {
        paVar1 = mesh->mVertices;
        fVar11 = *(float *)((long)paVar1 + lVar3 + -8);
        fVar5 = *(float *)((long)paVar1 + lVar3 + -4);
        fVar12 = *(float *)((long)&paVar1->x + lVar3);
        fVar6 = (local_74 * fVar12 + local_6c * fVar11 + local_70 * fVar5 + 0.0) - local_b8.x;
        fVar4 = (local_80 * fVar12 + local_78 * fVar11 + local_7c * fVar5 + 0.0) - local_b8.y;
        fVar11 = (fVar12 * local_8c + fVar11 * local_84 + fVar5 * local_88 + 0.0) - local_b8.z;
        fVar5 = 1.0 / SQRT(fVar11 * fVar11 + fVar6 * fVar6 + fVar4 * fVar4);
        local_a8 = atan2f(fVar4 * fVar5,fVar6 * fVar5);
        fStack_a4 = extraout_XMM0_Db;
        fVar11 = asinf(fVar5 * fVar11);
        auVar7._0_4_ = local_a8 + 3.1415927;
        auVar7._4_4_ = fVar11 + 1.5707964;
        auVar7._8_4_ = fStack_a4 + 0.0;
        auVar7._12_4_ = extraout_XMM0_Db_00 + 0.0;
        auVar8 = divps(auVar7,_DAT_006aea20);
        *(long *)((long)out + lVar3 + -8) = auVar8._0_8_;
        *(undefined4 *)((long)&out->x + lVar3) = 0;
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0xc;
      } while (uVar2 < mesh->mNumVertices);
    }
  }
  RemoveUVSeams(mesh,out);
  return;
}

Assistant:

void ComputeUVMappingProcess::ComputeSphereMapping(aiMesh* mesh,const aiVector3D& axis, aiVector3D* out)
{
    aiVector3D center, min, max;
    FindMeshCenter(mesh, center, min, max);

    // If the axis is one of x,y,z run a faster code path. It's worth the extra effort ...
    // currently the mapping axis will always be one of x,y,z, except if the
    // PretransformVertices step is used (it transforms the meshes into worldspace,
    // thus changing the mapping axis)
    if (axis * base_axis_x >= angle_epsilon)    {

        // For each point get a normalized projection vector in the sphere,
        // get its longitude and latitude and map them to their respective
        // UV axes. Problems occur around the poles ... unsolvable.
        //
        // The spherical coordinate system looks like this:
        // x = cos(lon)*cos(lat)
        // y = sin(lon)*cos(lat)
        // z = sin(lat)
        //
        // Thus we can derive:
        // lat  = arcsin (z)
        // lon  = arctan (y/x)
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D diff = (mesh->mVertices[pnt]-center).Normalize();
            out[pnt] = aiVector3D((std::atan2(diff.z, diff.y) + AI_MATH_PI_F ) / AI_MATH_TWO_PI_F,
                (std::asin  (diff.x) + AI_MATH_HALF_PI_F) / AI_MATH_PI_F, 0.0);
        }
    }
    else if (axis * base_axis_y >= angle_epsilon)   {
        // ... just the same again
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D diff = (mesh->mVertices[pnt]-center).Normalize();
            out[pnt] = aiVector3D((std::atan2(diff.x, diff.z) + AI_MATH_PI_F ) / AI_MATH_TWO_PI_F,
                (std::asin  (diff.y) + AI_MATH_HALF_PI_F) / AI_MATH_PI_F, 0.0);
        }
    }
    else if (axis * base_axis_z >= angle_epsilon)   {
        // ... just the same again
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D diff = (mesh->mVertices[pnt]-center).Normalize();
            out[pnt] = aiVector3D((std::atan2(diff.y, diff.x) + AI_MATH_PI_F ) / AI_MATH_TWO_PI_F,
                (std::asin  (diff.z) + AI_MATH_HALF_PI_F) / AI_MATH_PI_F, 0.0);
        }
    }
    // slower code path in case the mapping axis is not one of the coordinate system axes
    else    {
        aiMatrix4x4 mTrafo;
        aiMatrix4x4::FromToMatrix(axis,base_axis_y,mTrafo);

        // again the same, except we're applying a transformation now
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D diff = ((mTrafo*mesh->mVertices[pnt])-center).Normalize();
            out[pnt] = aiVector3D((std::atan2(diff.y, diff.x) + AI_MATH_PI_F ) / AI_MATH_TWO_PI_F,
                (std::asin(diff.z) + AI_MATH_HALF_PI_F) / AI_MATH_PI_F, 0.0);
        }
    }


    // Now find and remove UV seams. A seam occurs if a face has a tcoord
    // close to zero on the one side, and a tcoord close to one on the
    // other side.
    RemoveUVSeams(mesh,out);
}